

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_67::BinaryReaderIR::SetBlockDeclaration
          (BinaryReaderIR *this,BlockDeclaration *decl,Type sig_type)

{
  bool bVar1;
  Index index;
  reference ppFVar2;
  TypeVector local_b0;
  Location local_88;
  Var local_68;
  Index local_20;
  Type local_1c;
  Index type_index;
  Type sig_type_local;
  BlockDeclaration *decl_local;
  BinaryReaderIR *this_local;
  
  local_1c = sig_type;
  _type_index = decl;
  decl_local = (BlockDeclaration *)this;
  bVar1 = IsTypeIndex(sig_type);
  if (bVar1) {
    index = GetTypeIndex(local_1c);
    _type_index->has_func_type = true;
    local_20 = index;
    Location::Location(&local_88);
    Var::Var(&local_68,index,&local_88);
    Var::operator=(&_type_index->type_var,&local_68);
    Var::~Var(&local_68);
    ppFVar2 = std::vector<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>::operator[]
                        (&this->module_->func_types,(ulong)local_20);
    FuncSignature::operator=(&_type_index->sig,&(*ppFVar2)->sig);
  }
  else {
    _type_index->has_func_type = false;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::clear(&(_type_index->sig).param_types);
    GetInlineTypeVector(&local_b0,local_1c);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
              (&(_type_index->sig).result_types,&local_b0);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_b0);
  }
  return;
}

Assistant:

void BinaryReaderIR::SetBlockDeclaration(BlockDeclaration* decl,
                                         Type sig_type) {
  if (IsTypeIndex(sig_type)) {
    Index type_index = GetTypeIndex(sig_type);
    decl->has_func_type = true;
    decl->type_var = Var(type_index);
    decl->sig = module_->func_types[type_index]->sig;
  } else {
    decl->has_func_type = false;
    decl->sig.param_types.clear();
    decl->sig.result_types = GetInlineTypeVector(sig_type);
  }
}